

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Soccer.cpp
# Opt level: O2

int __thiscall anon_unknown.dwarf_a14fb::MicTestPlugIn::close(MicTestPlugIn *this,int __fd)

{
  pointer ppPVar1;
  uint i;
  ulong uVar2;
  
  uVar2 = 0;
  while( true ) {
    ppPVar1 = (this->TeamA).
              super__Vector_base<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (this->m_PlayerCountA <= uVar2) break;
    if (ppPVar1[uVar2] != (Player *)0x0) {
      (*(ppPVar1[uVar2]->super_SimpleVehicle).super_SimpleVehicle_3.
        super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
        super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
        super_AbstractLocalSpace._vptr_AbstractLocalSpace[1])();
    }
    uVar2 = uVar2 + 1;
  }
  if ((this->TeamA).
      super__Vector_base<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppPVar1) {
    (this->TeamA).
    super__Vector_base<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppPVar1;
  }
  uVar2 = 0;
  while( true ) {
    ppPVar1 = (this->TeamB).
              super__Vector_base<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (this->m_PlayerCountB <= uVar2) break;
    if (ppPVar1[uVar2] != (Player *)0x0) {
      (*(ppPVar1[uVar2]->super_SimpleVehicle).super_SimpleVehicle_3.
        super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
        super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
        super_AbstractLocalSpace._vptr_AbstractLocalSpace[1])();
    }
    uVar2 = uVar2 + 1;
  }
  if ((this->TeamB).
      super__Vector_base<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppPVar1) {
    (this->TeamB).
    super__Vector_base<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppPVar1;
  }
  ppPVar1 = (this->m_AllPlayers).
            super__Vector_base<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_AllPlayers).
      super__Vector_base<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppPVar1) {
    (this->m_AllPlayers).
    super__Vector_base<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppPVar1;
  }
  return (int)ppPVar1;
}

Assistant:

void close (void)
        {
            for(unsigned int i=0; i < m_PlayerCountA ; i++)
                delete TeamA[i];
            TeamA.clear ();
            for(unsigned int i=0; i < m_PlayerCountB ; i++)
                delete TeamB[i];
            TeamB.clear ();
                    m_AllPlayers.clear();
        }